

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

void helpSuccessorNode(args *t,edge *helpeeEdge,size_t depth)

{
  node *child;
  undefined7 uVar1;
  __pointer_type p;
  node *child_00;
  stateRecord *state_00;
  seekRecord *s;
  stateRecord *state;
  node *left;
  node *node;
  node *parent;
  size_t depth_local;
  edge *helpeeEdge_local;
  args *t_local;
  
  child = helpeeEdge->parent;
  p = std::atomic::operator_cast_to_node_((atomic *)helpeeEdge->child->child);
  child_00 = getAddress(p);
  state_00 = (stateRecord *)malloc(0x98);
  fillTheEdge(&state_00->targetEdge,(node *)0x0,child_00,false);
  state_00->depth = depth;
  state_00->mode = DISCOVERY;
  (state_00->successorRecord).lastEdge.parent = helpeeEdge->parent;
  (state_00->successorRecord).lastEdge.child = helpeeEdge->child;
  uVar1 = *(undefined7 *)&helpeeEdge->field_0x11;
  (state_00->successorRecord).lastEdge.which = helpeeEdge->which;
  *(undefined7 *)&(state_00->successorRecord).lastEdge.field_0x11 = uVar1;
  fillTheEdge(&(state_00->successorRecord).pLastEdge,(node *)0x0,child,false);
  removeSuccessor(t,state_00);
  return;
}

Assistant:

void helpSuccessorNode(struct args* t, struct edge* helpeeEdge, size_t depth)
{
    struct node* parent;
    struct node* node;
    struct node* left;
    struct stateRecord* state;
    struct seekRecord* s;
    parent = helpeeEdge->parent;
    node = helpeeEdge->child;
    left=getAddress(node->child[LC]);
    state = (struct stateRecord*) malloc(sizeof(struct stateRecord));
    fillTheEdge(&state->targetEdge,NULL,left,LC);
    state->depth = depth;
    state->mode = DISCOVERY;
    s = &state->successorRecord;
    s->lastEdge = *helpeeEdge;
    fillTheEdge(&s->pLastEdge,NULL,parent,LC);
    removeSuccessor(t,state);
    return;
}